

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

Map<int,_google::protobuf::Duration> * __thiscall
google::protobuf::internal::TypeDefinedMapFieldBase<int,_google::protobuf::Duration>::MutableMap
          (TypeDefinedMapFieldBase<int,_google::protobuf::Duration> *this)

{
  TypeDefinedMapFieldBase<int,_google::protobuf::Duration> *this_local;
  
  MapFieldBase::SyncMapWithRepeatedField(&this->super_MapFieldBase);
  MapFieldBase::SetMapDirty(&this->super_MapFieldBase);
  return (Map<int,_google::protobuf::Duration> *)&this->field_0;
}

Assistant:

Map<Key, T>* MutableMap() {
    SyncMapWithRepeatedField();
    SetMapDirty();
    return &map_;
  }